

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O1

char * qpdf_oh_get_string_value(qpdf_data qpdf,qpdf_oh oh)

{
  char *pcVar1;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  char *local_10;
  
  local_38._M_unused._M_object = &local_10;
  local_10 = "";
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<const_char_*(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:865:12)>
             ::_M_manager;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1312:46)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<const_char_*(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/qpdf-c.cc:1312:46)>
             ::_M_manager;
  local_58._M_unused._M_object = qpdf;
  pcVar1 = do_with_oh<char_const*>
                     (qpdf,oh,(function<const_char_*()> *)&local_38,
                      (function<const_char_*(QPDFObjectHandle_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return pcVar1;
}

Assistant:

char const*
qpdf_oh_get_string_value(qpdf_data qpdf, qpdf_oh oh)
{
    return do_with_oh<char const*>(
        qpdf, oh, return_T<char const*>(""), [qpdf](QPDFObjectHandle& o) {
            QTC::TC("qpdf", "qpdf-c called qpdf_oh_get_string_value");
            qpdf->tmp_string = o.getStringValue();
            return qpdf->tmp_string.c_str();
        });
}